

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O2

pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> * __thiscall
uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::getUrlSegment
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> *__return_storage_ptr__
          ,HttpRouter<uWS::HttpContextData<true>::RouterData> *this,int urlSegment)

{
  char **ppcVar1;
  string_view *this_00;
  char *pcVar2;
  bool bVar3;
  size_t sVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  
  if (this->urlSegmentTop < urlSegment) {
    sVar4 = (this->currentUrl)._M_len;
    if (99 < urlSegment || sVar4 == 0) {
      (__return_storage_ptr__->first)._M_len = 0;
      (__return_storage_ptr__->first)._M_str = (char *)0x0;
      bVar3 = true;
      goto LAB_00173788;
    }
    ppcVar1 = &(this->currentUrl)._M_str;
    *ppcVar1 = *ppcVar1 + 1;
    this_00 = &this->currentUrl;
    (this->currentUrl)._M_len = sVar4 - 1;
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find(this_00,'/',0);
    if (sVar4 == 0xffffffffffffffff) {
      sVar4 = (this->currentUrl)._M_len;
    }
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr(this_00,0,sVar4);
    this->urlSegmentVector[urlSegment]._M_len = bVar5._M_len;
    this->urlSegmentVector[urlSegment]._M_str = bVar5._M_str;
    this->urlSegmentTop = this->urlSegmentTop + 1;
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (this_00,sVar4,0xffffffffffffffff);
    (this->currentUrl)._M_len = bVar5._M_len;
    (this->currentUrl)._M_str = bVar5._M_str;
  }
  pcVar2 = this->urlSegmentVector[urlSegment]._M_str;
  (__return_storage_ptr__->first)._M_len = this->urlSegmentVector[urlSegment]._M_len;
  (__return_storage_ptr__->first)._M_str = pcVar2;
  bVar3 = false;
LAB_00173788:
  __return_storage_ptr__->second = bVar3;
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string_view, bool> getUrlSegment(int urlSegment) {
        if (urlSegment > urlSegmentTop) {
            /* Signal as STOP when we have no more URL or stack space */
            if (!currentUrl.length() || urlSegment > 99) {
                return {{}, true};
            }

            /* We always stand on a slash here, so step over it */
            currentUrl.remove_prefix(1);

            auto segmentLength = currentUrl.find('/');
            if (segmentLength == std::string::npos) {
                segmentLength = currentUrl.length();

                /* Push to url segment vector */
                urlSegmentVector[urlSegment] = currentUrl.substr(0, segmentLength);
                urlSegmentTop++;

                /* Update currentUrl */
                currentUrl = currentUrl.substr(segmentLength);
            } else {
                /* Push to url segment vector */
                urlSegmentVector[urlSegment] = currentUrl.substr(0, segmentLength);
                urlSegmentTop++;

                /* Update currentUrl */
                currentUrl = currentUrl.substr(segmentLength);
            }
        }
        /* In any case we return it */
        return {urlSegmentVector[urlSegment], false};
    }